

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace_striped_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_nw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  parasail_matrix_t *ppVar2;
  void *pvVar3;
  longlong lVar4;
  longlong lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  parasail_result_t *ppVar23;
  longlong lVar24;
  __m128i *palVar25;
  __m128i *palVar26;
  __m128i *palVar27;
  __m128i *palVar28;
  short sVar29;
  short sVar30;
  int a;
  int iVar31;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  __m128i *palVar32;
  undefined4 in_register_00000084;
  longlong lVar33;
  longlong in_R9;
  ushort uVar34;
  ushort uVar40;
  longlong extraout_XMM0_Qa;
  ushort uVar38;
  ushort uVar39;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  undefined1 auVar35 [16];
  ushort uVar44;
  longlong extraout_XMM0_Qb;
  undefined1 auVar36 [16];
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qb_00;
  undefined1 auVar37 [16];
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i alVar45;
  __m128i alVar46;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  __m128i mask_03;
  __m128i mask_04;
  __m128i mask_05;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  __m128i vH_03;
  __m128i vH_04;
  __m128i vH_05;
  ulong local_dc8;
  long local_db8;
  long local_db0;
  ulong uStack_d88;
  __m128i vH_1;
  __m128i vT_5;
  __m128i cond_4;
  __m128i vEa_ext_1;
  __m128i vEa_1;
  __m128i vT_4;
  __m128i cond_3;
  __m128i vTAll_3;
  __m128i cond_2;
  __m128i case2_1;
  __m128i case1_1;
  __m128i vT_3;
  __m128i vTAll_2;
  __m128i vHp;
  int16_t tmp2;
  int64_t tmp_4;
  __m128i vT_2;
  __m128i cond_1;
  __m128i vTAll_1;
  __m128i vT_1;
  __m128i cond;
  __m128i vEa_ext;
  __m128i vEa;
  __m128i vT;
  __m128i case2;
  __m128i case1;
  __m128i vTAll;
  __m128i *tmp_3;
  __m128i *tmp_2;
  __m128i *vP;
  __m128i vH_dag;
  __m128i vH;
  __m128i vFa_ext;
  __m128i vFa;
  __m128i vF_ext;
  __m128i vF;
  __m128i vE_ext;
  __m128i vE;
  __m128i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int local_b00;
  int local_afc;
  int32_t segNum;
  int32_t index;
  __m128i vFTMask;
  __m128i vTMask;
  __m128i vTDelF;
  __m128i vTDiagF;
  __m128i vTInsE;
  __m128i vTDiagE;
  __m128i vTDiag;
  __m128i vTDel;
  __m128i vTIns;
  parasail_result_t *result;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  short local_a0e;
  int16_t score;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  int16_t *boundary;
  __m128i *pvHT;
  __m128i *pvEaLoad;
  __m128i *pvEaStore;
  __m128i *pvE;
  __m128i *pvHLoad;
  __m128i *pvHStore;
  __m128i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int local_980;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  short local_718;
  short sStack_716;
  short sStack_714;
  short sStack_712;
  short sStack_710;
  short sStack_70e;
  short sStack_70c;
  short sStack_70a;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  short local_6d8;
  short sStack_6d6;
  short sStack_6d4;
  short sStack_6d2;
  short sStack_6d0;
  short sStack_6ce;
  short sStack_6cc;
  short sStack_6ca;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short local_6a8;
  short sStack_6a6;
  short sStack_6a4;
  short sStack_6a2;
  short sStack_6a0;
  short sStack_69e;
  short sStack_69c;
  short sStack_69a;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  short local_678;
  short sStack_676;
  short sStack_674;
  short sStack_672;
  short sStack_670;
  short sStack_66e;
  short sStack_66c;
  short sStack_66a;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short local_648;
  short sStack_646;
  short sStack_644;
  short sStack_642;
  short sStack_640;
  short sStack_63e;
  short sStack_63c;
  short sStack_63a;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  short local_618;
  short sStack_616;
  short sStack_614;
  short sStack_612;
  short sStack_610;
  short sStack_60e;
  short sStack_60c;
  short sStack_60a;
  short local_5f8;
  short sStack_5f6;
  short sStack_5f4;
  short sStack_5f2;
  short sStack_5f0;
  short sStack_5ee;
  short sStack_5ec;
  short sStack_5ea;
  short local_598;
  short sStack_596;
  short sStack_594;
  short sStack_592;
  short sStack_590;
  short sStack_58e;
  short sStack_58c;
  short sStack_58a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  
  lVar33 = CONCAT44(in_register_00000084,gap);
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse2_128_16","profile");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_trace_striped_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_trace_striped_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_trace_striped_profile_sse2_128_16","s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_trace_striped_profile_sse2_128_16","open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_trace_striped_profile_sse2_128_16","gap");
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    local_980 = iVar1 + -1;
    matrix._4_4_ = s2Len + -1;
    ppVar2 = profile->matrix;
    a = (iVar1 + 7) / 8;
    pvVar3 = (profile->profile16).score;
    i._0_2_ = (short)open;
    uVar19 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar20 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    j._0_2_ = (undefined2)gap;
    uVar21 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    uVar22 = CONCAT26((undefined2)j,CONCAT24((undefined2)j,CONCAT22((undefined2)j,(undefined2)j)));
    if (ppVar2->min <= -open) {
      i._0_2_ = -(short)ppVar2->min;
    }
    sVar29 = (short)i + -0x7fff;
    sVar30 = ((ushort)ppVar2->max ^ 0x7fff) - 1;
    ppVar23 = (parasail_result_t *)CONCAT26(sVar29,CONCAT24(sVar29,CONCAT22(sVar29,sVar29)));
    lVar24 = CONCAT26(sVar29,CONCAT24(sVar29,CONCAT22(sVar29,sVar29)));
    vSaturationCheckMax[1] = CONCAT26(sVar30,CONCAT24(sVar30,CONCAT22(sVar30,sVar30)));
    vSaturationCheckMin[0] = CONCAT26(sVar30,CONCAT24(sVar30,CONCAT22(sVar30,sVar30)));
    vFTMask[1] = 0x78007800780078;
    _segNum = 0x1f001f001f001f;
    vFTMask[0] = 0x1f001f001f001f;
    profile_local = (parasail_profile_t *)parasail_result_new_trace(a,s2Len,0x10,0x10);
    if (profile_local == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x8280801;
      pvHLoad = parasail_memalign___m128i(0x10,(long)a);
      pvE = parasail_memalign___m128i(0x10,(long)a);
      ptr = parasail_memalign___m128i(0x10,(long)a);
      pvEaLoad = parasail_memalign___m128i(0x10,(long)a);
      pvHT = parasail_memalign___m128i(0x10,(long)a);
      ptr_00 = parasail_memalign___m128i(0x10,(long)a);
      ptr_01 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      if (pvHLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvE == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvEaLoad == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (pvHT == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        local_afc = 0;
        for (k = 0; k < a; k = k + 1) {
          for (local_b00 = 0; local_b00 < 8; local_b00 = local_b00 + 1) {
            local_db8 = (long)(-(gap * (local_b00 * a + k)) - open);
            local_db0 = local_db8;
            if (local_db8 < -0x8000) {
              local_db0 = -0x8000;
            }
            *(short *)((long)&e + (long)local_b00 * 2 + 8) = (short)local_db0;
            local_db8 = local_db8 - open;
            if (local_db8 < -0x8000) {
              local_db8 = -0x8000;
            }
            *(short *)((long)&tmp + (long)local_b00 * 2) = (short)local_db8;
          }
          pvHLoad[local_afc][0] = e.m[1];
          pvHLoad[local_afc][1] = h.m[0];
          ptr[local_afc][0] = tmp;
          ptr[local_afc][1] = e.m[0];
          pvEaLoad[local_afc][0] = tmp;
          pvEaLoad[local_afc][1] = e.m[0];
          local_afc = local_afc + 1;
        }
        *ptr_01 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          iVar31 = -(gap * (k + -1)) - open;
          if (iVar31 < -0x8000) {
            iVar31 = -0x8000;
          }
          ptr_01[k] = (int16_t)iVar31;
        }
        for (k = 0; k < a; k = k + 1) {
          alVar46[0] = (ulong)(uint)k;
          alVar46[1]._0_4_ = a;
          alVar46[1]._4_4_ = 0;
          arr_store((__m128i *)
                    ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                    rowcols->score_row,alVar46,0,(int32_t)lVar33,(int32_t)in_R9);
        }
        result = ppVar23;
        vSaturationCheckMax[0] = lVar24;
        for (s1Len = 0; palVar28 = pvHLoad, palVar27 = pvE, palVar26 = pvEaLoad, palVar25 = pvHT,
            s1Len < s2Len; s1Len = s1Len + 1) {
          vH_00[0] = pvHLoad[a + -1][0];
          vH[0] = pvHLoad[a + -1][1] << 0x10 | vH_00[0] >> 0x30;
          vH_dag[1] = vH_00[0] << 0x10 | (ulong)(ushort)ptr_01[s1Len];
          iVar31 = ppVar2->mapper[(byte)s2[s1Len]] * a;
          pvE = pvHLoad;
          pvHLoad = palVar27;
          pvHT = pvEaLoad;
          pvEaLoad = palVar25;
          vF_ext[1] = (longlong)ppVar23;
          vF[0] = lVar24;
          for (k = 0; k < a; k = k + 1) {
            palVar32 = ptr + k;
            lVar4 = (*palVar32)[0];
            lVar5 = (*palVar32)[1];
            alVar46 = *palVar32;
            auVar35._8_8_ = vH[0];
            auVar35._0_8_ = vH_dag[1];
            auVar35 = paddsw(auVar35,*(undefined1 (*) [16])
                                      ((long)pvVar3 + (long)k * 0x10 + (long)iVar31 * 0x10));
            local_618 = auVar35._0_2_;
            sStack_616 = auVar35._2_2_;
            sStack_614 = auVar35._4_2_;
            sStack_612 = auVar35._6_2_;
            sStack_610 = auVar35._8_2_;
            sStack_60e = auVar35._10_2_;
            sStack_60c = auVar35._12_2_;
            sStack_60a = auVar35._14_2_;
            local_628 = (short)lVar4;
            sStack_626 = (short)((ulong)lVar4 >> 0x10);
            sStack_624 = (short)((ulong)lVar4 >> 0x20);
            sStack_622 = (short)((ulong)lVar4 >> 0x30);
            sStack_620 = (short)lVar5;
            sStack_61e = (short)((ulong)lVar5 >> 0x10);
            sStack_61c = (short)((ulong)lVar5 >> 0x20);
            sStack_61a = (short)((ulong)lVar5 >> 0x30);
            uVar34 = (ushort)(local_618 < local_628) * local_628 |
                     (ushort)(local_618 >= local_628) * local_618;
            uVar38 = (ushort)(sStack_616 < sStack_626) * sStack_626 |
                     (ushort)(sStack_616 >= sStack_626) * sStack_616;
            uVar39 = (ushort)(sStack_614 < sStack_624) * sStack_624 |
                     (ushort)(sStack_614 >= sStack_624) * sStack_614;
            uVar40 = (ushort)(sStack_612 < sStack_622) * sStack_622 |
                     (ushort)(sStack_612 >= sStack_622) * sStack_612;
            uVar41 = (ushort)(sStack_610 < sStack_620) * sStack_620 |
                     (ushort)(sStack_610 >= sStack_620) * sStack_610;
            uVar42 = (ushort)(sStack_60e < sStack_61e) * sStack_61e |
                     (ushort)(sStack_60e >= sStack_61e) * sStack_60e;
            uVar43 = (ushort)(sStack_60c < sStack_61c) * sStack_61c |
                     (ushort)(sStack_60c >= sStack_61c) * sStack_60c;
            uVar44 = (ushort)(sStack_60a < sStack_61a) * sStack_61a |
                     (ushort)(sStack_60a >= sStack_61a) * sStack_60a;
            local_648 = (short)vF_ext[1];
            sStack_646 = (short)((ulong)vF_ext[1] >> 0x10);
            sStack_644 = (short)((ulong)vF_ext[1] >> 0x20);
            sStack_642 = (short)((ulong)vF_ext[1] >> 0x30);
            sStack_640 = (short)vF[0];
            sStack_63e = (short)((ulong)vF[0] >> 0x10);
            sStack_63c = (short)((ulong)vF[0] >> 0x20);
            sStack_63a = (short)((ulong)vF[0] >> 0x30);
            uVar34 = (ushort)((short)uVar34 < local_648) * local_648 |
                     ((short)uVar34 >= local_648) * uVar34;
            uVar38 = (ushort)((short)uVar38 < sStack_646) * sStack_646 |
                     ((short)uVar38 >= sStack_646) * uVar38;
            uVar39 = (ushort)((short)uVar39 < sStack_644) * sStack_644 |
                     ((short)uVar39 >= sStack_644) * uVar39;
            uVar40 = (ushort)((short)uVar40 < sStack_642) * sStack_642 |
                     ((short)uVar40 >= sStack_642) * uVar40;
            uVar41 = (ushort)((short)uVar41 < sStack_640) * sStack_640 |
                     ((short)uVar41 >= sStack_640) * uVar41;
            uVar42 = (ushort)((short)uVar42 < sStack_63e) * sStack_63e |
                     ((short)uVar42 >= sStack_63e) * uVar42;
            uVar43 = (ushort)((short)uVar43 < sStack_63c) * sStack_63c |
                     ((short)uVar43 >= sStack_63c) * uVar43;
            uVar44 = (ushort)((short)uVar44 < sStack_63a) * sStack_63a |
                     ((short)uVar44 >= sStack_63a) * uVar44;
            vH_dag[1]._0_4_ = CONCAT22(uVar38,uVar34);
            vH_dag[1]._0_6_ = CONCAT24(uVar39,(undefined4)vH_dag[1]);
            vH_dag[1] = CONCAT26(uVar40,(undefined6)vH_dag[1]);
            vH[0]._0_4_ = CONCAT22(uVar42,uVar41);
            vH[0]._0_6_ = CONCAT24(uVar43,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar44,(undefined6)vH[0]);
            palVar27[k][0] = vH_dag[1];
            palVar27[k][1] = vH[0];
            local_658 = (short)result;
            sStack_656 = (short)((ulong)result >> 0x10);
            sStack_654 = (short)((ulong)result >> 0x20);
            sStack_652 = (short)((ulong)result >> 0x30);
            sStack_650 = (short)vSaturationCheckMax[0];
            sStack_64e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_64c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_64a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            result._0_4_ = CONCAT22((sStack_656 < (short)uVar38) * uVar38 |
                                    (ushort)(sStack_656 >= (short)uVar38) * sStack_656,
                                    (local_658 < (short)uVar34) * uVar34 |
                                    (ushort)(local_658 >= (short)uVar34) * local_658);
            result._0_6_ = CONCAT24((sStack_654 < (short)uVar39) * uVar39 |
                                    (ushort)(sStack_654 >= (short)uVar39) * sStack_654,result._0_4_)
            ;
            result = (parasail_result_t *)
                     CONCAT26((sStack_652 < (short)uVar40) * uVar40 |
                              (ushort)(sStack_652 >= (short)uVar40) * sStack_652,result._0_6_);
            vSaturationCheckMax[0]._0_4_ =
                 CONCAT22((sStack_64e < (short)uVar42) * uVar42 |
                          (ushort)(sStack_64e >= (short)uVar42) * sStack_64e,
                          (sStack_650 < (short)uVar41) * uVar41 |
                          (ushort)(sStack_650 >= (short)uVar41) * sStack_650);
            vSaturationCheckMax[0]._0_6_ =
                 CONCAT24((sStack_64c < (short)uVar43) * uVar43 |
                          (ushort)(sStack_64c >= (short)uVar43) * sStack_64c,
                          (undefined4)vSaturationCheckMax[0]);
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_64a < (short)uVar44) * uVar44 |
                          (ushort)(sStack_64a >= (short)uVar44) * sStack_64a,
                          (undefined6)vSaturationCheckMax[0]);
            local_598 = (short)vSaturationCheckMax[1];
            sStack_596 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_594 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_592 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_590 = (short)vSaturationCheckMin[0];
            sStack_58e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_58c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_58a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            uVar34 = ((short)uVar34 < local_598) * uVar34 |
                     (ushort)((short)uVar34 >= local_598) * local_598;
            uVar38 = ((short)uVar38 < sStack_596) * uVar38 |
                     (ushort)((short)uVar38 >= sStack_596) * sStack_596;
            uVar39 = ((short)uVar39 < sStack_594) * uVar39 |
                     (ushort)((short)uVar39 >= sStack_594) * sStack_594;
            uVar40 = ((short)uVar40 < sStack_592) * uVar40 |
                     (ushort)((short)uVar40 >= sStack_592) * sStack_592;
            uVar41 = ((short)uVar41 < sStack_590) * uVar41 |
                     (ushort)((short)uVar41 >= sStack_590) * sStack_590;
            uVar42 = ((short)uVar42 < sStack_58e) * uVar42 |
                     (ushort)((short)uVar42 >= sStack_58e) * sStack_58e;
            uVar43 = ((short)uVar43 < sStack_58c) * uVar43 |
                     (ushort)((short)uVar43 >= sStack_58c) * sStack_58c;
            uVar44 = ((short)uVar44 < sStack_58a) * uVar44 |
                     (ushort)((short)uVar44 >= sStack_58a) * sStack_58a;
            uVar34 = (ushort)(local_628 < (short)uVar34) * local_628 |
                     (local_628 >= (short)uVar34) * uVar34;
            uVar38 = (ushort)(sStack_626 < (short)uVar38) * sStack_626 |
                     (sStack_626 >= (short)uVar38) * uVar38;
            uVar39 = (ushort)(sStack_624 < (short)uVar39) * sStack_624 |
                     (sStack_624 >= (short)uVar39) * uVar39;
            uVar40 = (ushort)(sStack_622 < (short)uVar40) * sStack_622 |
                     (sStack_622 >= (short)uVar40) * uVar40;
            uVar41 = (ushort)(sStack_620 < (short)uVar41) * sStack_620 |
                     (sStack_620 >= (short)uVar41) * uVar41;
            uVar42 = (ushort)(sStack_61e < (short)uVar42) * sStack_61e |
                     (sStack_61e >= (short)uVar42) * uVar42;
            uVar43 = (ushort)(sStack_61c < (short)uVar43) * sStack_61c |
                     (sStack_61c >= (short)uVar43) * uVar43;
            uVar44 = (ushort)(sStack_61a < (short)uVar44) * sStack_61a |
                     (sStack_61a >= (short)uVar44) * uVar44;
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22((ushort)(sStack_646 < (short)uVar38) * sStack_646 |
                          (sStack_646 >= (short)uVar38) * uVar38,
                          (ushort)(local_648 < (short)uVar34) * local_648 |
                          (local_648 >= (short)uVar34) * uVar34);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24((ushort)(sStack_644 < (short)uVar39) * sStack_644 |
                          (sStack_644 >= (short)uVar39) * uVar39,(undefined4)vSaturationCheckMax[1])
            ;
            vSaturationCheckMax[1] =
                 CONCAT26((ushort)(sStack_642 < (short)uVar40) * sStack_642 |
                          (sStack_642 >= (short)uVar40) * uVar40,(undefined6)vSaturationCheckMax[1])
            ;
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22((ushort)(sStack_63e < (short)uVar42) * sStack_63e |
                          (sStack_63e >= (short)uVar42) * uVar42,
                          (ushort)(sStack_640 < (short)uVar41) * sStack_640 |
                          (sStack_640 >= (short)uVar41) * uVar41);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24((ushort)(sStack_63c < (short)uVar43) * sStack_63c |
                          (sStack_63c >= (short)uVar43) * uVar43,(undefined4)vSaturationCheckMin[0])
            ;
            vSaturationCheckMin[0] =
                 CONCAT26((ushort)(sStack_63a < (short)uVar44) * sStack_63a |
                          (sStack_63a >= (short)uVar44) * uVar44,(undefined6)vSaturationCheckMin[0])
            ;
            palVar32 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_04[0] = (ulong)(uint)k;
            vH_00[0] = (ulong)(uint)s1Len;
            alVar45 = arr_load(palVar32,k,a,s1Len);
            b[0] = alVar45[1];
            alVar45[1] = vH_04[0];
            alVar45[0] = (longlong)palVar32;
            b[1] = vH_00[0];
            mask[1] = in_R9;
            mask[0] = lVar33;
            alVar45 = _mm_blendv_epi8_rpl(alVar45,b,mask);
            b_00[0] = alVar45[1];
            a_00[1] = vH_04[0];
            a_00[0] = (longlong)palVar32;
            b_00[1] = vH_00[0];
            mask_00[1] = in_R9;
            mask_00[0] = lVar33;
            _mm_blendv_epi8_rpl(a_00,b_00,mask_00);
            ptr_00[k][0] = extraout_XMM0_Qa;
            ptr_00[k][1] = extraout_XMM0_Qb;
            palVar32 = (__m128i *)
                       ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                       rowcols->score_row;
            vH_00[0] = (ulong)(uint)k;
            vH_00[1]._0_4_ = a;
            vH_00[1]._4_4_ = 0;
            arr_store(palVar32,vH_00,s1Len,(int32_t)lVar33,(int32_t)in_R9);
            auVar16._8_8_ = vH[0];
            auVar16._0_8_ = vH_dag[1];
            auVar15._8_8_ = uVar20;
            auVar15._0_8_ = uVar19;
            auVar35 = psubsw(auVar16,auVar15);
            auVar37._8_8_ = uVar22;
            auVar37._0_8_ = uVar21;
            auVar36 = psubsw((undefined1  [16])alVar46,auVar37);
            local_678 = auVar35._0_2_;
            sStack_676 = auVar35._2_2_;
            sStack_674 = auVar35._4_2_;
            sStack_672 = auVar35._6_2_;
            sStack_670 = auVar35._8_2_;
            sStack_66e = auVar35._10_2_;
            sStack_66c = auVar35._12_2_;
            sStack_66a = auVar35._14_2_;
            local_688 = auVar36._0_2_;
            sStack_686 = auVar36._2_2_;
            sStack_684 = auVar36._4_2_;
            sStack_682 = auVar36._6_2_;
            sStack_680 = auVar36._8_2_;
            sStack_67e = auVar36._10_2_;
            sStack_67c = auVar36._12_2_;
            sStack_67a = auVar36._14_2_;
            vE_ext[1] = CONCAT26((ushort)(sStack_672 < sStack_682) * sStack_682 |
                                 (ushort)(sStack_672 >= sStack_682) * sStack_672,
                                 CONCAT24((ushort)(sStack_674 < sStack_684) * sStack_684 |
                                          (ushort)(sStack_674 >= sStack_684) * sStack_674,
                                          CONCAT22((ushort)(sStack_676 < sStack_686) * sStack_686 |
                                                   (ushort)(sStack_676 >= sStack_686) * sStack_676,
                                                   (ushort)(local_678 < local_688) * local_688 |
                                                   (ushort)(local_678 >= local_688) * local_678)));
            vE[0] = CONCAT26((ushort)(sStack_66a < sStack_67a) * sStack_67a |
                             (ushort)(sStack_66a >= sStack_67a) * sStack_66a,
                             CONCAT24((ushort)(sStack_66c < sStack_67c) * sStack_67c |
                                      (ushort)(sStack_66c >= sStack_67c) * sStack_66c,
                                      CONCAT22((ushort)(sStack_66e < sStack_67e) * sStack_67e |
                                               (ushort)(sStack_66e >= sStack_67e) * sStack_66e,
                                               (ushort)(sStack_670 < sStack_680) * sStack_680 |
                                               (ushort)(sStack_670 >= sStack_680) * sStack_670)));
            ptr[k][0] = vE_ext[1];
            ptr[k][1] = vE[0];
            auVar36._8_8_ = uVar22;
            auVar36._0_8_ = uVar21;
            auVar35 = psubsw((undefined1  [16])palVar26[k],auVar36);
            local_6a8 = auVar35._0_2_;
            sStack_6a6 = auVar35._2_2_;
            sStack_6a4 = auVar35._4_2_;
            sStack_6a2 = auVar35._6_2_;
            sStack_6a0 = auVar35._8_2_;
            sStack_69e = auVar35._10_2_;
            sStack_69c = auVar35._12_2_;
            sStack_69a = auVar35._14_2_;
            vEa_ext[1] = CONCAT26((ushort)(sStack_672 < sStack_6a2) * sStack_6a2 |
                                  (ushort)(sStack_672 >= sStack_6a2) * sStack_672,
                                  CONCAT24((ushort)(sStack_674 < sStack_6a4) * sStack_6a4 |
                                           (ushort)(sStack_674 >= sStack_6a4) * sStack_674,
                                           CONCAT22((ushort)(sStack_676 < sStack_6a6) * sStack_6a6 |
                                                    (ushort)(sStack_676 >= sStack_6a6) * sStack_676,
                                                    (ushort)(local_678 < local_6a8) * local_6a8 |
                                                    (ushort)(local_678 >= local_6a8) * local_678)));
            vEa[0] = CONCAT26((ushort)(sStack_66a < sStack_69a) * sStack_69a |
                              (ushort)(sStack_66a >= sStack_69a) * sStack_66a,
                              CONCAT24((ushort)(sStack_66c < sStack_69c) * sStack_69c |
                                       (ushort)(sStack_66c >= sStack_69c) * sStack_66c,
                                       CONCAT22((ushort)(sStack_66e < sStack_69e) * sStack_69e |
                                                (ushort)(sStack_66e >= sStack_69e) * sStack_66e,
                                                (ushort)(sStack_670 < sStack_6a0) * sStack_6a0 |
                                                (ushort)(sStack_670 >= sStack_6a0) * sStack_670)));
            b_01[1] = (long)k * 0x10;
            palVar25[k][0] = vEa_ext[1];
            palVar25[k][1] = vEa[0];
            if (s1Len + 1 < s2Len) {
              a_01[1] = vH_00[0];
              a_01[0] = (longlong)palVar32;
              b_01[0] = extraout_RDX;
              mask_01[1] = in_R9;
              mask_01[0] = lVar33;
              _mm_blendv_epi8_rpl(a_01,b_01,mask_01);
              vH_01[0] = (ulong)(uint)k;
              vH_01[1]._0_4_ = a;
              vH_01[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_01,s1Len + 1,(int32_t)lVar33,(int32_t)in_R9);
            }
            auVar14._8_8_ = vF[0];
            auVar14._0_8_ = vF_ext[1];
            auVar13._8_8_ = uVar22;
            auVar13._0_8_ = uVar21;
            auVar35 = psubsw(auVar14,auVar13);
            local_6c8 = auVar35._0_2_;
            sStack_6c6 = auVar35._2_2_;
            sStack_6c4 = auVar35._4_2_;
            sStack_6c2 = auVar35._6_2_;
            sStack_6c0 = auVar35._8_2_;
            sStack_6be = auVar35._10_2_;
            sStack_6bc = auVar35._12_2_;
            sStack_6ba = auVar35._14_2_;
            vF_ext[1] = CONCAT26((ushort)(sStack_672 < sStack_6c2) * sStack_6c2 |
                                 (ushort)(sStack_672 >= sStack_6c2) * sStack_672,
                                 CONCAT24((ushort)(sStack_674 < sStack_6c4) * sStack_6c4 |
                                          (ushort)(sStack_674 >= sStack_6c4) * sStack_674,
                                          CONCAT22((ushort)(sStack_676 < sStack_6c6) * sStack_6c6 |
                                                   (ushort)(sStack_676 >= sStack_6c6) * sStack_676,
                                                   (ushort)(local_678 < local_6c8) * local_6c8 |
                                                   (ushort)(local_678 >= local_6c8) * local_678)));
            vF[0] = CONCAT26((ushort)(sStack_66a < sStack_6ba) * sStack_6ba |
                             (ushort)(sStack_66a >= sStack_6ba) * sStack_66a,
                             CONCAT24((ushort)(sStack_66c < sStack_6bc) * sStack_6bc |
                                      (ushort)(sStack_66c >= sStack_6bc) * sStack_66c,
                                      CONCAT22((ushort)(sStack_66e < sStack_6be) * sStack_6be |
                                               (ushort)(sStack_66e >= sStack_6be) * sStack_66e,
                                               (ushort)(sStack_670 < sStack_6c0) * sStack_6c0 |
                                               (ushort)(sStack_670 >= sStack_6c0) * sStack_670)));
            if (k + 1 < a) {
              palVar32 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_04[0] = (ulong)(k + 1U);
              vH_00[0] = (ulong)(uint)s1Len;
              alVar46 = arr_load(palVar32,k + 1U,a,s1Len);
              b_02[0] = alVar46[1];
              a_02[1] = vH_04[0];
              a_02[0] = (longlong)palVar32;
              b_02[1] = vH_00[0];
              mask_02[1] = in_R9;
              mask_02[0] = lVar33;
              _mm_blendv_epi8_rpl(a_02,b_02,mask_02);
              vH_02[0] = (ulong)(k + 1);
              vH_02[1]._0_4_ = a;
              vH_02[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_02,s1Len,(int32_t)lVar33,(int32_t)in_R9);
            }
            vH_dag[1] = palVar28[k][0];
            vH[0] = palVar28[k][1];
          }
          vFa_ext[1] = vF_ext[1];
          vFa[0] = vF[0];
          for (end_query = 0; end_query < 8; end_query = end_query + 1) {
            local_dc8 = (ulong)(ptr_01[s1Len + 1] - open);
            if ((long)local_dc8 < -0x8000) {
              local_dc8 = 0xffffffffffff8000;
            }
            vH_00[0] = palVar28[a + -1][0];
            vHp[0] = palVar28[a + -1][1] << 0x10 | vH_00[0] >> 0x30;
            vTAll_2[1] = vH_00[0] << 0x10 | (ulong)(ushort)ptr_01[s1Len];
            vF[0] = vF[0] << 0x10 | (ulong)vF_ext[1] >> 0x30;
            vF_ext[1] = vF_ext[1] << 0x10 | local_dc8 & 0xffff;
            vFa[0] = vFa[0] << 0x10 | (ulong)vFa_ext[1] >> 0x30;
            vFa_ext[1] = vFa_ext[1] << 0x10 | local_dc8 & 0xffff;
            for (k = 0; k < a; k = k + 1) {
              lVar4 = palVar27[k][0];
              lVar5 = palVar27[k][1];
              local_6d8 = (short)lVar4;
              sStack_6d6 = (short)((ulong)lVar4 >> 0x10);
              sStack_6d4 = (short)((ulong)lVar4 >> 0x20);
              sStack_6d2 = (short)((ulong)lVar4 >> 0x30);
              sStack_6d0 = (short)lVar5;
              sStack_6ce = (short)((ulong)lVar5 >> 0x10);
              sStack_6cc = (short)((ulong)lVar5 >> 0x20);
              sStack_6ca = (short)((ulong)lVar5 >> 0x30);
              local_6e8 = (short)vF_ext[1];
              sStack_6e6 = (short)((ulong)vF_ext[1] >> 0x10);
              sStack_6e4 = (short)((ulong)vF_ext[1] >> 0x20);
              sStack_6e2 = (short)((ulong)vF_ext[1] >> 0x30);
              sStack_6e0 = (short)vF[0];
              sStack_6de = (short)((ulong)vF[0] >> 0x10);
              sStack_6dc = (short)((ulong)vF[0] >> 0x20);
              sStack_6da = (short)((ulong)vF[0] >> 0x30);
              uVar34 = (ushort)(local_6d8 < local_6e8) * local_6e8 |
                       (ushort)(local_6d8 >= local_6e8) * local_6d8;
              uVar38 = (ushort)(sStack_6d6 < sStack_6e6) * sStack_6e6 |
                       (ushort)(sStack_6d6 >= sStack_6e6) * sStack_6d6;
              uVar39 = (ushort)(sStack_6d4 < sStack_6e4) * sStack_6e4 |
                       (ushort)(sStack_6d4 >= sStack_6e4) * sStack_6d4;
              uVar40 = (ushort)(sStack_6d2 < sStack_6e2) * sStack_6e2 |
                       (ushort)(sStack_6d2 >= sStack_6e2) * sStack_6d2;
              uVar41 = (ushort)(sStack_6d0 < sStack_6e0) * sStack_6e0 |
                       (ushort)(sStack_6d0 >= sStack_6e0) * sStack_6d0;
              uVar42 = (ushort)(sStack_6ce < sStack_6de) * sStack_6de |
                       (ushort)(sStack_6ce >= sStack_6de) * sStack_6ce;
              uVar43 = (ushort)(sStack_6cc < sStack_6dc) * sStack_6dc |
                       (ushort)(sStack_6cc >= sStack_6dc) * sStack_6cc;
              uVar44 = (ushort)(sStack_6ca < sStack_6da) * sStack_6da |
                       (ushort)(sStack_6ca >= sStack_6da) * sStack_6ca;
              vH_dag[1]._0_4_ = CONCAT22(uVar38,uVar34);
              vH_dag[1]._0_6_ = CONCAT24(uVar39,(undefined4)vH_dag[1]);
              vH_dag[1] = CONCAT26(uVar40,(undefined6)vH_dag[1]);
              vH[0]._0_4_ = CONCAT22(uVar42,uVar41);
              vH[0]._0_6_ = CONCAT24(uVar43,(undefined4)vH[0]);
              vH[0] = CONCAT26(uVar44,(undefined6)vH[0]);
              palVar27[k][0] = vH_dag[1];
              palVar27[k][1] = vH[0];
              local_5f8 = (short)vSaturationCheckMax[1];
              sStack_5f6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
              sStack_5f4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
              sStack_5f2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
              sStack_5f0 = (short)vSaturationCheckMin[0];
              sStack_5ee = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
              sStack_5ec = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
              sStack_5ea = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
              vSaturationCheckMax[1]._0_4_ =
                   CONCAT22(((short)uVar38 < sStack_5f6) * uVar38 |
                            (ushort)((short)uVar38 >= sStack_5f6) * sStack_5f6,
                            ((short)uVar34 < local_5f8) * uVar34 |
                            (ushort)((short)uVar34 >= local_5f8) * local_5f8);
              vSaturationCheckMax[1]._0_6_ =
                   CONCAT24(((short)uVar39 < sStack_5f4) * uVar39 |
                            (ushort)((short)uVar39 >= sStack_5f4) * sStack_5f4,
                            (undefined4)vSaturationCheckMax[1]);
              vSaturationCheckMax[1] =
                   CONCAT26(((short)uVar40 < sStack_5f2) * uVar40 |
                            (ushort)((short)uVar40 >= sStack_5f2) * sStack_5f2,
                            (undefined6)vSaturationCheckMax[1]);
              vSaturationCheckMin[0]._0_4_ =
                   CONCAT22(((short)uVar42 < sStack_5ee) * uVar42 |
                            (ushort)((short)uVar42 >= sStack_5ee) * sStack_5ee,
                            ((short)uVar41 < sStack_5f0) * uVar41 |
                            (ushort)((short)uVar41 >= sStack_5f0) * sStack_5f0);
              vSaturationCheckMin[0]._0_6_ =
                   CONCAT24(((short)uVar43 < sStack_5ec) * uVar43 |
                            (ushort)((short)uVar43 >= sStack_5ec) * sStack_5ec,
                            (undefined4)vSaturationCheckMin[0]);
              vSaturationCheckMin[0] =
                   CONCAT26(((short)uVar44 < sStack_5ea) * uVar44 |
                            (ushort)((short)uVar44 >= sStack_5ea) * sStack_5ea,
                            (undefined6)vSaturationCheckMin[0]);
              local_6f8 = (short)result;
              sStack_6f6 = (short)((ulong)result >> 0x10);
              sStack_6f4 = (short)((ulong)result >> 0x20);
              sStack_6f2 = (short)((ulong)result >> 0x30);
              sStack_6f0 = (short)vSaturationCheckMax[0];
              sStack_6ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
              sStack_6ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
              sStack_6ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
              result._0_4_ = CONCAT22((sStack_6f6 < (short)uVar38) * uVar38 |
                                      (ushort)(sStack_6f6 >= (short)uVar38) * sStack_6f6,
                                      (local_6f8 < (short)uVar34) * uVar34 |
                                      (ushort)(local_6f8 >= (short)uVar34) * local_6f8);
              result._0_6_ = CONCAT24((sStack_6f4 < (short)uVar39) * uVar39 |
                                      (ushort)(sStack_6f4 >= (short)uVar39) * sStack_6f4,
                                      result._0_4_);
              result = (parasail_result_t *)
                       CONCAT26((sStack_6f2 < (short)uVar40) * uVar40 |
                                (ushort)(sStack_6f2 >= (short)uVar40) * sStack_6f2,result._0_6_);
              vSaturationCheckMax[0]._0_4_ =
                   CONCAT22((sStack_6ee < (short)uVar42) * uVar42 |
                            (ushort)(sStack_6ee >= (short)uVar42) * sStack_6ee,
                            (sStack_6f0 < (short)uVar41) * uVar41 |
                            (ushort)(sStack_6f0 >= (short)uVar41) * sStack_6f0);
              vSaturationCheckMax[0]._0_6_ =
                   CONCAT24((sStack_6ec < (short)uVar43) * uVar43 |
                            (ushort)(sStack_6ec >= (short)uVar43) * sStack_6ec,
                            (undefined4)vSaturationCheckMax[0]);
              vSaturationCheckMax[0] =
                   CONCAT26((sStack_6ea < (short)uVar44) * uVar44 |
                            (ushort)(sStack_6ea >= (short)uVar44) * sStack_6ea,
                            (undefined6)vSaturationCheckMax[0]);
              paddsw((undefined1  [16])stack0xfffffffffffff348,
                     *(undefined1 (*) [16])((long)pvVar3 + (long)k * 0x10 + (long)iVar31 * 0x10));
              palVar32 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_00[0] = (ulong)(uint)k;
              alVar46 = arr_load(palVar32,k,a,s1Len);
              b_03[0] = alVar46[1];
              b_03[1] = (long)k * 0x10;
              a_03[1] = vH_00[0];
              a_03[0] = (longlong)palVar32;
              mask_03[1] = in_R9;
              mask_03[0] = lVar33;
              _mm_blendv_epi8_rpl(a_03,b_03,mask_03);
              ptr_00[k][0] = extraout_XMM0_Qa_00;
              ptr_00[k][1] = extraout_XMM0_Qb_00;
              vH_03[0] = (ulong)(uint)k;
              vH_03[1]._0_4_ = a;
              vH_03[1]._4_4_ = 0;
              arr_store((__m128i *)
                        ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                        rowcols->score_row,vH_03,s1Len,(int32_t)lVar33,(int32_t)in_R9);
              palVar32 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_04[0] = (ulong)(uint)k;
              vH_00[0] = (ulong)(uint)s1Len;
              alVar46 = arr_load(palVar32,k,a,s1Len);
              b_04[0] = alVar46[1];
              a_04[1] = vH_04[0];
              a_04[0] = (longlong)palVar32;
              b_04[1] = vH_00[0];
              mask_04[1] = in_R9;
              mask_04[0] = lVar33;
              _mm_blendv_epi8_rpl(a_04,b_04,mask_04);
              palVar32 = (__m128i *)
                         ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)->
                         rowcols->score_row;
              vH_04[0] = (ulong)(uint)k;
              vH_04[1]._0_4_ = a;
              vH_04[1]._4_4_ = 0;
              arr_store(palVar32,vH_04,s1Len,(int32_t)lVar33,(int32_t)in_R9);
              auVar12._8_8_ = vH[0];
              auVar12._0_8_ = vH_dag[1];
              auVar11._8_8_ = uVar20;
              auVar11._0_8_ = uVar19;
              auVar35 = psubsw(auVar12,auVar11);
              auVar10._8_8_ = vF[0];
              auVar10._0_8_ = vF_ext[1];
              auVar9._8_8_ = uVar22;
              auVar9._0_8_ = uVar21;
              auVar36 = psubsw(auVar10,auVar9);
              auVar8._8_8_ = uVar22;
              auVar8._0_8_ = uVar21;
              auVar37 = psubsw((undefined1  [16])palVar26[k],auVar8);
              local_718 = auVar35._0_2_;
              sStack_716 = auVar35._2_2_;
              sStack_714 = auVar35._4_2_;
              sStack_712 = auVar35._6_2_;
              sStack_710 = auVar35._8_2_;
              sStack_70e = auVar35._10_2_;
              sStack_70c = auVar35._12_2_;
              sStack_70a = auVar35._14_2_;
              local_728 = auVar37._0_2_;
              sStack_726 = auVar37._2_2_;
              sStack_724 = auVar37._4_2_;
              sStack_722 = auVar37._6_2_;
              sStack_720 = auVar37._8_2_;
              sStack_71e = auVar37._10_2_;
              sStack_71c = auVar37._12_2_;
              sStack_71a = auVar37._14_2_;
              vEa_ext_1[1] = CONCAT26((ushort)(sStack_712 < sStack_722) * sStack_722 |
                                      (ushort)(sStack_712 >= sStack_722) * sStack_712,
                                      CONCAT24((ushort)(sStack_714 < sStack_724) * sStack_724 |
                                               (ushort)(sStack_714 >= sStack_724) * sStack_714,
                                               CONCAT22((ushort)(sStack_716 < sStack_726) *
                                                        sStack_726 |
                                                        (ushort)(sStack_716 >= sStack_726) *
                                                        sStack_716,
                                                        (ushort)(local_718 < local_728) * local_728
                                                        | (ushort)(local_718 >= local_728) *
                                                          local_718)));
              vEa_1[0] = CONCAT26((ushort)(sStack_70a < sStack_71a) * sStack_71a |
                                  (ushort)(sStack_70a >= sStack_71a) * sStack_70a,
                                  CONCAT24((ushort)(sStack_70c < sStack_71c) * sStack_71c |
                                           (ushort)(sStack_70c >= sStack_71c) * sStack_70c,
                                           CONCAT22((ushort)(sStack_70e < sStack_71e) * sStack_71e |
                                                    (ushort)(sStack_70e >= sStack_71e) * sStack_70e,
                                                    (ushort)(sStack_710 < sStack_720) * sStack_720 |
                                                    (ushort)(sStack_710 >= sStack_720) * sStack_710)
                                          ));
              b_05[1] = (long)k * 0x10;
              palVar25[k][0] = vEa_ext_1[1];
              palVar25[k][1] = vEa_1[0];
              if (s1Len + 1 < s2Len) {
                a_05[1] = vH_04[0];
                a_05[0] = (longlong)palVar32;
                b_05[0] = extraout_RDX_00;
                mask_05[1] = in_R9;
                mask_05[0] = lVar33;
                _mm_blendv_epi8_rpl(a_05,b_05,mask_05);
                vH_05[0] = (ulong)(uint)k;
                vH_05[1]._0_4_ = a;
                vH_05[1]._4_4_ = 0;
                arr_store((__m128i *)
                          ((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&profile_local->matrix)
                          ->rowcols->score_row,vH_05,s1Len + 1,(int32_t)lVar33,(int32_t)in_R9);
              }
              vFa[1] = auVar36._0_8_;
              vF_ext[0] = auVar36._8_8_;
              local_2f8 = auVar36._0_2_;
              sStack_2f6 = auVar36._2_2_;
              sStack_2f4 = auVar36._4_2_;
              sStack_2f2 = auVar36._6_2_;
              sStack_2f0 = auVar36._8_2_;
              sStack_2ee = auVar36._10_2_;
              sStack_2ec = auVar36._12_2_;
              sStack_2ea = auVar36._14_2_;
              vH_00[0] = CONCAT26(-(ushort)(sStack_70a < sStack_2ea),
                                  CONCAT24(-(ushort)(sStack_70c < sStack_2ec),
                                           CONCAT22(-(ushort)(sStack_70e < sStack_2ee),
                                                    -(ushort)(sStack_710 < sStack_2f0)))) |
                         CONCAT26(-(ushort)(sStack_2ea == sStack_70a),
                                  CONCAT24(-(ushort)(sStack_2ec == sStack_70c),
                                           CONCAT22(-(ushort)(sStack_2ee == sStack_70e),
                                                    -(ushort)(sStack_2f0 == sStack_710))));
              auVar18._8_8_ = vH_00[0];
              auVar18._0_8_ =
                   CONCAT26(-(ushort)(sStack_712 < sStack_2f2),
                            CONCAT24(-(ushort)(sStack_714 < sStack_2f4),
                                     CONCAT22(-(ushort)(sStack_716 < sStack_2f6),
                                              -(ushort)(local_718 < local_2f8)))) |
                   CONCAT26(-(ushort)(sStack_2f2 == sStack_712),
                            CONCAT24(-(ushort)(sStack_2f4 == sStack_714),
                                     CONCAT22(-(ushort)(sStack_2f6 == sStack_716),
                                              -(ushort)(local_2f8 == local_718))));
              if ((((((((((((((((auVar18 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar18 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar18 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar18 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar18 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar18 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar18 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar18 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (vH_00[0] >> 7 & 1) == 0) && (vH_00[0] >> 0xf & 1) == 0) &&
                      (vH_00[0] >> 0x17 & 1) == 0) && (vH_00[0] >> 0x1f & 1) == 0) &&
                    (vH_00[0] >> 0x27 & 1) == 0) && (vH_00[0] >> 0x2f & 1) == 0) &&
                  (vH_00[0] >> 0x37 & 1) == 0) && -1 < (long)vH_00[0]) goto LAB_00877629;
              vF_ext[1] = vFa[1];
              vF[0] = vF_ext[0];
              auVar7._8_8_ = vFa[0];
              auVar7._0_8_ = vFa_ext[1];
              auVar6._8_8_ = uVar22;
              auVar6._0_8_ = uVar21;
              auVar35 = psubsw(auVar7,auVar6);
              local_748 = auVar35._0_2_;
              sStack_746 = auVar35._2_2_;
              sStack_744 = auVar35._4_2_;
              sStack_742 = auVar35._6_2_;
              sStack_740 = auVar35._8_2_;
              sStack_73e = auVar35._10_2_;
              sStack_73c = auVar35._12_2_;
              sStack_73a = auVar35._14_2_;
              vFa_ext[1] = CONCAT26((ushort)(sStack_712 < sStack_742) * sStack_742 |
                                    (ushort)(sStack_712 >= sStack_742) * sStack_712,
                                    CONCAT24((ushort)(sStack_714 < sStack_744) * sStack_744 |
                                             (ushort)(sStack_714 >= sStack_744) * sStack_714,
                                             CONCAT22((ushort)(sStack_716 < sStack_746) * sStack_746
                                                      | (ushort)(sStack_716 >= sStack_746) *
                                                        sStack_716,
                                                      (ushort)(local_718 < local_748) * local_748 |
                                                      (ushort)(local_718 >= local_748) * local_718))
                                   );
              vFa[0] = CONCAT26((ushort)(sStack_70a < sStack_73a) * sStack_73a |
                                (ushort)(sStack_70a >= sStack_73a) * sStack_70a,
                                CONCAT24((ushort)(sStack_70c < sStack_73c) * sStack_73c |
                                         (ushort)(sStack_70c >= sStack_73c) * sStack_70c,
                                         CONCAT22((ushort)(sStack_70e < sStack_73e) * sStack_73e |
                                                  (ushort)(sStack_70e >= sStack_73e) * sStack_70e,
                                                  (ushort)(sStack_710 < sStack_740) * sStack_740 |
                                                  (ushort)(sStack_710 >= sStack_740) * sStack_710)))
              ;
              unique0x10003f95 = palVar28[k];
            }
          }
LAB_00877629:
        }
        vH_1[0] = pvHLoad[(iVar1 + -1) % a][1];
        uStack_d88 = pvHLoad[(iVar1 + -1) % a][0];
        for (end_query = 0; end_query < (int)(~((iVar1 + -1) / a) + 8U); end_query = end_query + 1)
        {
          vH_1[0] = vH_1[0] << 0x10 | uStack_d88 >> 0x30;
          uStack_d88 = uStack_d88 << 0x10;
        }
        local_a0e = vH_1[0]._6_2_;
        local_1c8 = (short)vSaturationCheckMax[1];
        sStack_1c6 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_1c4 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_1c2 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_1c0 = (short)vSaturationCheckMin[0];
        sStack_1be = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1bc = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1ba = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_318 = (short)result;
        sStack_316 = (short)((ulong)result >> 0x10);
        sStack_314 = (short)((ulong)result >> 0x20);
        sStack_312 = (short)((ulong)result >> 0x30);
        sStack_310 = (short)vSaturationCheckMax[0];
        sStack_30e = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_30c = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_30a = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        vH_00[0] = CONCAT26(-(ushort)(sStack_1ba < sVar29),
                            CONCAT24(-(ushort)(sStack_1bc < sVar29),
                                     CONCAT22(-(ushort)(sStack_1be < sVar29),
                                              -(ushort)(sStack_1c0 < sVar29)))) |
                   CONCAT26(-(ushort)(sVar30 < sStack_30a),
                            CONCAT24(-(ushort)(sVar30 < sStack_30c),
                                     CONCAT22(-(ushort)(sVar30 < sStack_30e),
                                              -(ushort)(sVar30 < sStack_310))));
        auVar17._8_8_ = vH_00[0];
        auVar17._0_8_ =
             CONCAT26(-(ushort)(sStack_1c2 < sVar29),
                      CONCAT24(-(ushort)(sStack_1c4 < sVar29),
                               CONCAT22(-(ushort)(sStack_1c6 < sVar29),-(ushort)(local_1c8 < sVar29)
                                       ))) |
             CONCAT26(-(ushort)(sVar30 < sStack_312),
                      CONCAT24(-(ushort)(sVar30 < sStack_314),
                               CONCAT22(-(ushort)(sVar30 < sStack_316),-(ushort)(sVar30 < local_318)
                                       )));
        if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (vH_00[0] >> 7 & 1) != 0) || (vH_00[0] >> 0xf & 1) != 0) ||
                (vH_00[0] >> 0x17 & 1) != 0) || (vH_00[0] >> 0x1f & 1) != 0) ||
              (vH_00[0] >> 0x27 & 1) != 0) || (vH_00[0] >> 0x2f & 1) != 0) ||
            (vH_00[0] >> 0x37 & 1) != 0) || (long)vH_00[0] < 0) {
          *(uint *)&profile_local->field_0xc = *(uint *)&profile_local->field_0xc | 0x40;
          local_a0e = 0;
          local_980 = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&profile_local->s1 = (int)local_a0e;
        *(int *)((long)&profile_local->s1 + 4) = local_980;
        profile_local->s1Len = matrix._4_4_;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(pvHT);
        parasail_free(pvEaLoad);
        parasail_free(ptr);
        parasail_free(pvE);
        parasail_free(pvHLoad);
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE = _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask = _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            _mm_store_si128(&pvEaStore[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad, pvHStore)
        SWAP(pvEaLoad, pvEaStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        vTDiag, case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }

            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }


        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, tmp2, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_LIMIT, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_LIMIT, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }
    }

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}